

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cxx::MessageGenerator::GenerateIsInitialized
          (MessageGenerator *this,Printer *printer)

{
  uint uVar1;
  int i;
  Printer *this_00;
  bool bVar2;
  char *__s;
  Descriptor *pDVar3;
  int bit;
  long lVar4;
  FieldDescriptor *field;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  uint32 value;
  long lVar8;
  long lVar9;
  allocator<char> local_b4;
  allocator_type local_b3;
  equal_to<const_google::protobuf::Descriptor_*> local_b2;
  hash<const_google::protobuf::Descriptor_*> local_b1;
  Printer *local_b0;
  char buffer [32];
  string local_78;
  Descriptor *local_58;
  string local_50;
  
  io::Printer::Print(printer,"bool $classname$::IsInitialized() const {\n","classname",
                     &this->classname_);
  local_b0 = printer;
  io::Printer::Indent(printer);
  uVar1 = *(uint *)(this->descriptor_ + 0x2c);
  if (0 < (int)uVar1) {
    lVar9 = 0x30;
    lVar8 = 0;
    uVar5 = 0;
    do {
      i = *(int *)(this->descriptor_ + 0x2c);
      lVar4 = 0;
      value = 0;
      lVar6 = lVar9;
      do {
        if ((long)i <= lVar4 + lVar8) break;
        uVar7 = 1 << ((byte)lVar4 & 0x1f);
        if (*(int *)(*(long *)(this->descriptor_ + 0x30) + lVar6) != 2) {
          uVar7 = 0;
        }
        value = value | uVar7;
        lVar4 = lVar4 + 1;
        lVar6 = lVar6 + 0x78;
      } while (lVar4 != 0x20);
      if (value != 0) {
        SimpleItoa_abi_cxx11_(&local_78,(protobuf *)(uVar5 & 0xffffffff),i);
        __s = FastHex32ToBuffer(value,buffer);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_b4);
        io::Printer::Print(local_b0,"if ((_has_bits_[$i$] & 0x$mask$) != 0x$mask$) return false;\n",
                           "i",&local_78,"mask",&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
      }
      uVar5 = uVar5 + 1;
      lVar8 = lVar8 + 0x20;
      lVar9 = lVar9 + 0xf00;
    } while (uVar5 != (ulong)uVar1 + 0x1f >> 5);
  }
  io::Printer::Print(local_b0,"\n");
  pDVar3 = this->descriptor_;
  if (0 < *(int *)(pDVar3 + 0x2c)) {
    lVar8 = 0;
    lVar9 = 0;
    do {
      lVar6 = *(long *)(pDVar3 + 0x30);
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(lVar6 + 0x2c + lVar8) * 4)
          == 10) {
        local_58 = *(Descriptor **)(lVar6 + 0x48 + lVar8);
        std::tr1::
        _Hashtable<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>,_std::_Identity<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_true,_true>
        ::_Hashtable((_Hashtable<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>,_std::_Identity<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_true,_true>
                      *)buffer,10,&local_b1,(_Mod_range_hashing *)&local_78,
                     (_Default_ranged_hash *)&local_50,&local_b2,
                     (_Identity<const_google::protobuf::Descriptor_*> *)&local_b4,&local_b3);
        bVar2 = anon_unknown_0::HasRequiredFields
                          (local_58,(hash_set<const_google::protobuf::Descriptor_*,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>_>
                                     *)buffer);
        std::tr1::
        _Hashtable<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>,_std::_Identity<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_true,_true>
        ::~_Hashtable((_Hashtable<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>,_std::_Identity<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_true,_true>
                       *)buffer);
        if (bVar2) {
          if (*(int *)(lVar6 + 0x30 + lVar8) == 3) {
            FieldName_abi_cxx11_((string *)buffer,(cxx *)(lVar8 + lVar6),field);
            io::Printer::Print(local_b0,
                               "for (int i = 0; i < $name$_size(); i++) {\n  if (!this->$name$(i).IsInitialized()) return false;\n}\n"
                               ,"name",(string *)buffer);
          }
          else {
            FieldName_abi_cxx11_((string *)buffer,(cxx *)(lVar8 + lVar6),field);
            io::Printer::Print(local_b0,
                               "if (has_$name$()) {\n  if (!this->$name$().IsInitialized()) return false;\n}\n"
                               ,"name",(string *)buffer);
          }
          if ((char *)buffer._0_8_ != buffer + 0x10) {
            operator_delete((void *)buffer._0_8_,buffer._16_8_ + 1);
          }
        }
      }
      lVar9 = lVar9 + 1;
      pDVar3 = this->descriptor_;
      lVar8 = lVar8 + 0x78;
    } while (lVar9 < *(int *)(pDVar3 + 0x2c));
  }
  this_00 = local_b0;
  if (0 < *(int *)(pDVar3 + 0x58)) {
    io::Printer::Print(local_b0,"\nif (!_extensions_.IsInitialized()) return false;");
  }
  io::Printer::Outdent(this_00);
  io::Printer::Print(this_00,"  return true;\n}\n");
  return;
}

Assistant:

void MessageGenerator::
GenerateIsInitialized(io::Printer* printer) {
  printer->Print(
    "bool $classname$::IsInitialized() const {\n",
    "classname", classname_);
  printer->Indent();

  // Check that all required fields in this message are set.  We can do this
  // most efficiently by checking 32 "has bits" at a time.
  int has_bits_array_size = (descriptor_->field_count() + 31) / 32;
  for (int i = 0; i < has_bits_array_size; i++) {
    uint32 mask = 0;
    for (int bit = 0; bit < 32; bit++) {
      int index = i * 32 + bit;
      if (index >= descriptor_->field_count()) break;
      const FieldDescriptor* field = descriptor_->field(index);

      if (field->is_required()) {
        mask |= 1 << bit;
      }
    }

    if (mask != 0) {
      char buffer[kFastToBufferSize];
      printer->Print(
        "if ((_has_bits_[$i$] & 0x$mask$) != 0x$mask$) return false;\n",
        "i", SimpleItoa(i),
        "mask", FastHex32ToBuffer(mask, buffer));
    }
  }

  // Now check that all embedded messages are initialized.
  printer->Print("\n");
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
        !ShouldIgnoreRequiredFieldCheck(field) &&
        HasRequiredFields(field->message_type())) {
      if (field->is_repeated()) {
        printer->Print(
          "for (int i = 0; i < $name$_size(); i++) {\n"
          "  if (!this->$name$(i).IsInitialized()) return false;\n"
          "}\n",
          "name", FieldName(field));
      } else {
        printer->Print(
          "if (has_$name$()) {\n"
          "  if (!this->$name$().IsInitialized()) return false;\n"
          "}\n",
          "name", FieldName(field));
      }
    }
  }

  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
      "\n"
      "if (!_extensions_.IsInitialized()) return false;");
  }

  printer->Outdent();
  printer->Print(
    "  return true;\n"
    "}\n");
}